

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void mqc_bypass_enc(opj_mqc_t *mqc,int d)

{
  int d_local;
  opj_mqc_t *mqc_local;
  
  mqc->ct = mqc->ct - 1;
  mqc->c = mqc->c + (d << ((byte)mqc->ct & 0x1f));
  if (mqc->ct == 0) {
    mqc->bp = mqc->bp + 1;
    *mqc->bp = (uchar)mqc->c;
    mqc->ct = 8;
    if (*mqc->bp == 0xff) {
      mqc->ct = 7;
    }
    mqc->c = 0;
  }
  return;
}

Assistant:

void mqc_bypass_enc(opj_mqc_t *mqc, int d) {
	mqc->ct--;
	mqc->c = mqc->c + (d << mqc->ct);
	if (mqc->ct == 0) {
		mqc->bp++;
		*mqc->bp = mqc->c;
		mqc->ct = 8;
		if (*mqc->bp == 0xff) {
			mqc->ct = 7;
		}
		mqc->c = 0;
	}
}